

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZStream.cpp
# Opt level: O0

void __thiscall TPZStream::Write(TPZStream *this,longdouble *p,int howMany)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  void *pvVar3;
  uint in_EDX;
  long in_RSI;
  long *in_RDI;
  uint i;
  double *copy;
  undefined4 local_24;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(int)in_EDX;
  uVar2 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pvVar3 = operator_new__(uVar2);
  for (local_24 = 0; local_24 < in_EDX; local_24 = local_24 + 1) {
    *(double *)((long)pvVar3 + (ulong)local_24 * 8) =
         (double)*(longdouble *)(in_RSI + (ulong)local_24 * 0x10);
  }
  (**(code **)(*in_RDI + 0x40))(in_RDI,pvVar3,in_EDX);
  if (pvVar3 != (void *)0x0) {
    operator_delete__(pvVar3);
  }
  return;
}

Assistant:

void TPZStream::Write(const long double *p, int howMany) {//weird but necessary for working between different OSs
    double *copy = new double[howMany];
    for (unsigned int i = 0; i < howMany; ++i) {
        copy[i] = (double) p[i];
    }
    Write(copy, howMany);
    delete[] copy;
}